

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fioldobj(void *ctx0,mclhd handle,uchar *ptr,ushort siz)

{
  ushort uVar1;
  FILE *__stream;
  errcxdef *ctx;
  undefined8 in_RAX;
  size_t sVar2;
  ushort *puVar3;
  char buf [7];
  char local_37 [3];
  ushort local_34;
  ushort local_32;
  
  local_37[0] = (char)((ulong)in_RAX >> 8);
  __stream = *ctx0;
  ctx = *(errcxdef **)((long)ctx0 + 8);
  fseek(__stream,handle + *(long *)((long)ctx0 + 0x10),0);
  sVar2 = fread(local_37,7,1,__stream);
  if (sVar2 == 1) {
    if (local_37[0] == '\x01') {
      puVar3 = &local_34;
    }
    else {
      if (local_37[0] != '\x02') {
        errsigf(ctx,"TADS",0x262);
      }
      puVar3 = &local_32;
    }
    uVar1 = *puVar3;
    if (siz < uVar1) {
      errsigf(ctx,"TADS",0x265);
    }
    sVar2 = fread(ptr,(ulong)uVar1,1,__stream);
    if (sVar2 == 1) {
      if ((*(byte *)((long)ctx0 + 0x18) & 8) == 0) {
        return;
      }
      fioxor(ptr,(uint)uVar1,*(uint *)((long)ctx0 + 0x1c),*(uint *)((long)ctx0 + 0x20));
      return;
    }
  }
  errsigf(ctx,"TADS",0x264);
}

Assistant:

void OS_LOADDS fioldobj(void *ctx0, mclhd handle, uchar *ptr, ushort siz)
{
    fiolcxdef  *ctx = (fiolcxdef *)ctx0;
    ulong       seekpos = (ulong)handle;
    osfildef   *fp = ctx->fiolcxfp;
    char        buf[7];
    errcxdef   *ec = ctx->fiolcxerr;
    uint        rdsiz;
    
    /* figure out what type of object is to be loaded */
    osfseek(fp, seekpos + ctx->fiolcxst, OSFSK_SET);
    if (osfrb(fp, buf, 7)) errsig(ec, ERR_LDGAM);
    switch(buf[0])
    {
    case TOKSTFUNC:
        rdsiz = osrp2(buf + 3);
        break;

    case TOKSTOBJ:
        rdsiz = osrp2(buf + 5);
        break;
        
    case TOKSTFWDOBJ:
    case TOKSTFWDFN:
    default:
        errsig(ec, ERR_UNKOTYP);
    }
    
    if (siz < rdsiz) errsig(ec, ERR_LDBIG);
    if (osfrb(fp, ptr, rdsiz)) errsig(ec, ERR_LDGAM);
    if (ctx->fiolcxflg & FIOFCRYPT)
        fioxor(ptr, rdsiz, ctx->fiolcxseed, ctx->fiolcxinc);
}